

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O0

void poly2_mod_phiN(poly2 *p)

{
  crypto_word_t cVar1;
  ulong local_20;
  size_t i;
  crypto_word_t m;
  poly2 *p_local;
  
  cVar1 = lsb_to_all(p->v[10] >> 0x3c);
  for (local_20 = 0; local_20 < 0xb; local_20 = local_20 + 1) {
    p->v[local_20] = cVar1 ^ p->v[local_20];
  }
  p->v[10] = p->v[10] & 0xfffffffffffffff;
  return;
}

Assistant:

static void poly2_mod_phiN(struct poly2 *p) {
  // m is the term at x^700, replicated to every bit.
  const crypto_word_t m =
      lsb_to_all(p->v[WORDS_PER_POLY - 1] >> (BITS_IN_LAST_WORD - 1));
  for (size_t i = 0; i < WORDS_PER_POLY; i++) {
    p->v[i] ^= m;
  }
  p->v[WORDS_PER_POLY - 1] &= (UINT64_C(1) << (BITS_IN_LAST_WORD - 1)) - 1;
}